

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O3

void __thiscall
ValidationSignals::TransactionAddedToMempool
          (ValidationSignals *this,NewMempoolTransactionInfo *tx,uint64_t mempool_sequence)

{
  undefined4 uVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar3;
  bool bVar4;
  Logger *this_01;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  undefined8 *local_128;
  undefined8 uStack_120;
  code *local_118;
  code *pcStack_110;
  char *local_name;
  CAmount local_f8;
  int64_t iStack_f0;
  uint local_e8;
  string local_d8;
  int64_t iStack_b8;
  uint local_b0;
  undefined4 local_a8;
  element_type *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  CAmount local_90;
  int64_t iStack_88;
  uint local_80;
  undefined4 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar2 = (tx->info).m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  this_00 = (tx->info).m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_e8 = (tx->info).txHeight;
  local_f8 = (tx->info).m_fee;
  iStack_f0 = (tx->info).m_virtual_transaction_size;
  uVar1._0_1_ = tx->m_mempool_limit_bypassed;
  uVar1._1_1_ = tx->m_submitted_in_package;
  uVar1._2_1_ = tx->m_chainstate_is_current;
  uVar1._3_1_ = tx->m_has_no_mempool_parents;
  local_name = "TransactionAddedToMempool";
  this_01 = LogInstance();
  bVar4 = BCLog::Logger::WillLogCategoryLevel(this_01,VALIDATION,Debug);
  if (bVar4) {
    base_blob<256u>::ToString_abi_cxx11_
              (&local_d8,
               &((tx->info).m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_58,
               &((tx->info).m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_witness_hash);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x67;
    logging_function._M_str = "TransactionAddedToMempool";
    logging_function._M_len = 0x19;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,199,VALIDATION,Debug,(ConstevalFormatString<3U>)0x812e13
               ,&local_name,&local_d8,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  uVar3._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  local_d8._M_dataplus._M_p = local_name;
  local_d8._M_string_length =
       (size_type)
       (tx->info).m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_d8.field_2._M_allocated_capacity =
       (size_type)
       (tx->info).m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.field_2._M_allocated_capacity)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_d8.field_2._M_allocated_capacity)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.field_2._M_allocated_capacity)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_d8.field_2._M_allocated_capacity)->_M_use_count + 1;
    }
  }
  local_b0 = (tx->info).txHeight;
  local_d8.field_2._8_8_ = (tx->info).m_fee;
  iStack_b8 = (tx->info).m_virtual_transaction_size;
  local_a8._0_1_ = tx->m_mempool_limit_bypassed;
  local_a8._1_1_ = tx->m_submitted_in_package;
  local_a8._2_1_ = tx->m_chainstate_is_current;
  local_a8._3_1_ = tx->m_has_no_mempool_parents;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_80 = local_e8;
  local_90 = local_f8;
  iStack_88 = iStack_f0;
  local_128 = (undefined8 *)0x0;
  uStack_120 = 0;
  local_118 = (code *)0x0;
  pcStack_110 = (code *)0x0;
  local_a0 = peVar2;
  local_98 = this_00;
  local_78 = uVar1;
  local_70 = mempool_sequence;
  uStack_68 = this;
  local_128 = (undefined8 *)operator_new(0x78);
  *local_128 = local_d8._M_dataplus._M_p;
  local_128[1] = local_d8._M_string_length;
  local_128[2] = local_d8.field_2._M_allocated_capacity;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_d8.field_2._M_allocated_capacity + 8) =
           *(_Atomic_word *)(local_d8.field_2._M_allocated_capacity + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_d8.field_2._M_allocated_capacity + 8) =
           *(_Atomic_word *)(local_d8.field_2._M_allocated_capacity + 8) + 1;
    }
  }
  *(uint *)(local_128 + 5) = local_b0;
  local_128[3] = local_d8.field_2._8_8_;
  local_128[4] = iStack_b8;
  *(undefined4 *)(local_128 + 6) = local_a8;
  local_128[7] = local_a0;
  local_128[8] = local_98;
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_98->_M_use_count = local_98->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_98->_M_use_count = local_98->_M_use_count + 1;
    }
  }
  *(uint *)(local_128 + 0xb) = local_80;
  local_128[9] = local_90;
  local_128[10] = iStack_88;
  *(undefined4 *)(local_128 + 0xc) = local_78;
  *(undefined4 *)(local_128 + 0xd) = (undefined4)local_70;
  *(undefined4 *)((long)local_128 + 0x6c) = local_70._4_4_;
  *(undefined4 *)(local_128 + 0xe) = (undefined4)uStack_68;
  *(undefined4 *)((long)local_128 + 0x74) = uStack_68._4_4_;
  pcStack_110 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:197:5)>
                ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:197:5)>
              ::_M_manager;
  (**(code **)(*(long *)uVar3._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar3._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl);
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,3);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_d8.field_2._M_allocated_capacity);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::TransactionAddedToMempool(const NewMempoolTransactionInfo& tx, uint64_t mempool_sequence)
{
    auto event = [tx, mempool_sequence, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.TransactionAddedToMempool(tx, mempool_sequence); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: txid=%s wtxid=%s", __func__,
                          tx.info.m_tx->GetHash().ToString(),
                          tx.info.m_tx->GetWitnessHash().ToString());
}